

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,StringTree *params_2,ArrayPtr<const_char> *params_3)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t sVar3;
  size_t result_2;
  long lVar4;
  char *pcVar5;
  String local_68;
  size_t local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_50 = this->size_;
  local_48 = (params->text).content.ptr;
  local_40 = params_1->ptr;
  local_38 = (params_2->text).content.ptr;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_50 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  __return_storage_ptr__->size_ = sVar3;
  sVar3 = 0;
  local_50 = 0;
  local_40 = (char *)0x0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_50 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  heapString(&local_68,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_68.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_68.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_68.content.disposer;
  local_50 = 1;
  sVar3 = 0;
  local_48 = (char *)0x0;
  local_40 = (char *)0x1;
  local_38 = (char *)0x0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_50 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  local_68.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_68.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_68.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_68.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_68.content.size_;
  (__return_storage_ptr__->branches).disposer = local_68.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,this,(ArrayPtr<const_char> *)params,
             (StringTree *)params_1,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}